

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O1

void Abc_NtkRestrashRandom_rec(Abc_Ntk_t *pNtk,Abc_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  void **ppvVar5;
  uint uVar6;
  int *piVar7;
  Abc_Obj_t *pAVar8;
  int in_EDX;
  int Fill;
  
  pAVar3 = pObj->pNtk;
  iVar1 = pObj->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,in_EDX);
  if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar4 = pObj->pNtk;
  iVar2 = pAVar4->nTravIds;
  if ((pAVar3->vTravIds).pArray[iVar1] != iVar2) {
    iVar1 = pObj->Id;
    Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
    if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar4->vTravIds).pArray[iVar1] = iVar2;
    if ((*(uint *)&pObj->field_0x14 & 0xf) == 7) {
      uVar6 = rand();
      piVar7 = (pObj->vFanins).pArray;
      ppvVar5 = pObj->pNtk->vObjs->pArray;
      if ((uVar6 & 1) == 0) {
        Abc_NtkRestrashRandom_rec(pNtk,(Abc_Obj_t *)ppvVar5[piVar7[1]]);
        piVar7 = (pObj->vFanins).pArray;
      }
      else {
        Abc_NtkRestrashRandom_rec(pNtk,(Abc_Obj_t *)ppvVar5[*piVar7]);
        piVar7 = (pObj->vFanins).pArray + 1;
      }
      Abc_NtkRestrashRandom_rec(pNtk,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*piVar7]);
      ppvVar5 = pObj->pNtk->vObjs->pArray;
      piVar7 = (pObj->vFanins).pArray;
      pAVar8 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,
                          (Abc_Obj_t *)
                          ((ulong)(*(uint *)&pObj->field_0x14 >> 10 & 1) ^
                          *(ulong *)((long)ppvVar5[*piVar7] + 0x40)),
                          (Abc_Obj_t *)
                          ((ulong)(*(uint *)&pObj->field_0x14 >> 0xb & 1) ^
                          *(ulong *)((long)ppvVar5[piVar7[1]] + 0x40)));
      (pObj->field_6).pCopy = pAVar8;
    }
  }
  return;
}

Assistant:

void Abc_NtkRestrashRandom_rec( Abc_Ntk_t * pNtk, Abc_Obj_t * pObj )
{
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( !Abc_ObjIsNode(pObj) )
        return;
    if ( rand() & 1 )
    {
        Abc_NtkRestrashRandom_rec( pNtk, Abc_ObjFanin0(pObj) );
        Abc_NtkRestrashRandom_rec( pNtk, Abc_ObjFanin1(pObj) );
    }
    else
    {
        Abc_NtkRestrashRandom_rec( pNtk, Abc_ObjFanin1(pObj) );
        Abc_NtkRestrashRandom_rec( pNtk, Abc_ObjFanin0(pObj) );
    }
    pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
}